

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O2

bool cmsys::SystemTools::Touch(string *filename,bool create)

{
  bool bVar1;
  int iVar2;
  FILE *__stream;
  timespec times [2];
  
  bVar1 = FileExists(filename);
  if (bVar1) {
    times[1].tv_sec = 0;
    times[1].tv_nsec = 0x3fffffff;
    times[0].tv_sec = 0;
    times[0].tv_nsec = 0x3ffffffe;
    iVar2 = utimensat(-100,(filename->_M_dataplus)._M_p,(timespec *)times,0);
    bVar1 = -1 < iVar2;
  }
  else {
    bVar1 = true;
    if (create) {
      __stream = (FILE *)Fopen(filename,"a+b");
      if (__stream == (FILE *)0x0) {
        bVar1 = false;
      }
      else {
        fclose(__stream);
      }
    }
  }
  return bVar1;
}

Assistant:

bool SystemTools::Touch(const kwsys_stl::string& filename, bool create)
{
  if (!SystemTools::FileExists(filename))
    {
    if(create)
      {
      FILE* file = Fopen(filename, "a+b");
      if(file)
        {
        fclose(file);
        return true;
        }
      return false;
      }
    else
      {
      return true;
      }
    }
#if defined(_WIN32) && !defined(__CYGWIN__)
  HANDLE h = CreateFileW(
    SystemTools::ConvertToWindowsExtendedPath(filename).c_str(),
    FILE_WRITE_ATTRIBUTES,
    FILE_SHARE_WRITE, 0, OPEN_EXISTING,
    FILE_FLAG_BACKUP_SEMANTICS, 0);
  if(!h)
    {
    return false;
    }
  FILETIME mtime;
  GetSystemTimeAsFileTime(&mtime);
  if(!SetFileTime(h, 0, 0, &mtime))
    {
    CloseHandle(h);
    return false;
    }
  CloseHandle(h);
#elif KWSYS_CXX_HAS_UTIMENSAT
  struct timespec times[2] = {{0,UTIME_OMIT},{0,UTIME_NOW}};
  if(utimensat(AT_FDCWD, filename.c_str(), times, 0) < 0)
    {
    return false;
    }
#else
  struct stat st;
  if(stat(filename.c_str(), &st) < 0)
    {
    return false;
    }
  struct timeval mtime;
  gettimeofday(&mtime, 0);
# if KWSYS_CXX_HAS_UTIMES
  struct timeval times[2] =
    {
#  if KWSYS_STAT_HAS_ST_MTIM
      {st.st_atim.tv_sec, st.st_atim.tv_nsec/1000}, /* tv_sec, tv_usec */
#  else
      {st.st_atime, 0},
#  endif
      mtime
    };
  if(utimes(filename.c_str(), times) < 0)
    {
    return false;
    }
# else
  struct utimbuf times = {st.st_atime, mtime.tv_sec};
  if(utime(filename.c_str(), &times) < 0)
    {
    return false;
    }
# endif
#endif
  return true;
}